

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
exe_reconstructor::add_sectioninfo
          (exe_reconstructor *this,string *name,uint64_t size,ReadWriter_ptr *r)

{
  ReadWriter_ptr local_50;
  shared_ptr<exe_reconstructor::sectioninfo> local_40;
  
  local_40.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x38);
  local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  sectioninfo::sectioninfo
            (local_40.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,name,size,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<exe_reconstructor::sectioninfo*>
            (&local_40.
              super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_40.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  std::
  vector<std::shared_ptr<exe_reconstructor::sectioninfo>,std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>>>
  ::emplace_back<std::shared_ptr<exe_reconstructor::sectioninfo>>
            ((vector<std::shared_ptr<exe_reconstructor::sectioninfo>,std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>>>
              *)&this->_sections,&local_40);
  if (local_40.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

void add_sectioninfo(const std::string& name, uint64_t size, ReadWriter_ptr r)
    {
        _sections.push_back(sectioninfo_ptr(new sectioninfo(name, size, r)));
    }